

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::GridDataType0::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridDataType0 *this)

{
  byte *pbVar1;
  ostream *poVar2;
  byte *pbVar3;
  KStringStream ss;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  GridData::GetAsString_abi_cxx11_(&local_1d0,&this->super_GridData);
  poVar2 = std::operator<<(local_1a0,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"GridDataType0:");
  poVar2 = std::operator<<(poVar2,"\n\tNumber Of Bytes: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ushort *)&(this->super_GridData).field_0xc);
  std::operator<<(poVar2,"\n\tData: ");
  std::__cxx11::string::~string((string *)&local_1d0);
  pbVar1 = (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->m_vui8DataVals).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    poVar2 = std::operator<<(local_1a0," ");
    std::ostream::operator<<(poVar2,(ushort)*pbVar3);
  }
  std::operator<<(local_1a0,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

KString GridDataType0::GetAsString() const
{
    KStringStream ss;

    ss << GridData::GetAsString()
       << "GridDataType0:"
       << "\n\tNumber Of Bytes: " << m_ui16NumBytes
       << "\n\tData: ";

    vector<KUINT8>::const_iterator citr = m_vui8DataVals.begin();
    vector<KUINT8>::const_iterator citrEnd = m_vui8DataVals.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << " " << ( KUINT16 )*citr;
    }
    ss << "\n";

    return ss.str();
}